

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

void Acb_ObjCollectTfo_rec(Acb_Ntk_t *p,int iObj,int fTerm)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  
  if ((iObj < 0) || ((p->vObjTrav).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar2 = (p->vObjTrav).pArray;
  iVar4 = p->nObjTravs;
  iVar1 = piVar2[(uint)iObj];
  piVar2[(uint)iObj] = iVar4;
  if (iVar1 == iVar4) {
    return;
  }
  if (fTerm == 0) {
    if (iObj == 0) {
LAB_003af4dc:
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                    ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
    }
    if ((p->vObjType).nSize <= iObj) {
LAB_003af4fb:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    if ((p->vObjType).pArray[(uint)iObj] == '\x04') {
      return;
    }
  }
  iVar4 = (p->vFanouts).nSize;
  if (iObj < iVar4) {
    lVar5 = 0;
    do {
      pVVar3 = (p->vFanouts).pArray;
      if (pVVar3[(uint)iObj].nSize <= lVar5) {
        Vec_IntPush(&p->vArray1,iObj);
        return;
      }
      iVar1 = pVVar3[(uint)iObj].pArray[lVar5];
      if ((long)iVar1 < 1) goto LAB_003af4dc;
      if ((p->vObjType).nSize <= iVar1) goto LAB_003af4fb;
      if ((p->vObjType).pArray[iVar1] != '\0') {
        Acb_ObjCollectTfo_rec(p,iVar1,fTerm);
        iVar4 = (p->vFanouts).nSize;
      }
      lVar5 = lVar5 + 1;
    } while (iObj < iVar4);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Acb_ObjCollectTfo_rec( Acb_Ntk_t * p, int iObj, int fTerm )
{
    int iFanout, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( !fTerm && Acb_ObjIsCo(p, iObj) )
        return;
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        Acb_ObjCollectTfo_rec( p, iFanout, fTerm );
    Vec_IntPush( &p->vArray1, iObj );
}